

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

bool __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<1>::erase_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  unsigned_long *puVar12;
  long lVar13;
  long lVar14;
  
  uVar10 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = (uVar10 & 0xffff) >> 10;
  uVar5 = (this->occupation).occupation;
  if ((uVar5 >> uVar2 & 1) != 0) {
    lVar8 = POPCOUNT(uVar5 >> (sbyte)uVar2);
    puVar12 = (this->hashes)._M_elems + lVar8 * 3 + -2;
    lVar6 = 0;
    lVar11 = 0;
    do {
      lVar14 = lVar11;
      lVar6 = lVar6 + -0x100000000;
      puVar12 = puVar12 + 3;
      lVar11 = lVar14 + 1;
    } while ((ushort)uVar2 < (ushort)((ushort)(this->hashes)._M_elems[lVar8 + lVar14 + -1] >> 10));
    uVar10 = uVar10 & 0xffff;
    iVar9 = 1;
    do {
      puVar12 = puVar12 + 3;
      iVar9 = iVar9 + -1;
      lVar13 = lVar11 + 1;
      lVar6 = lVar6 + -0x100000000;
      lVar3 = lVar11 + -2;
      lVar11 = lVar13;
    } while (uVar10 < (this->hashes)._M_elems[lVar8 + lVar3]);
    iVar1 = this->size;
    iVar7 = (int)lVar8;
    if ((iVar1 - iVar7) + 3 != (int)lVar13) {
      do {
        if ((this->hashes)._M_elems[lVar8 + lVar13 + -3] != uVar10) {
          return false;
        }
        if (*key == (int)*puVar12) {
          iVar4 = iVar1 + -1;
          this->size = iVar4;
          if (iVar7 + -3 + (int)lVar13 < iVar4) {
            lVar6 = (lVar8 << 0x20) - lVar6;
            lVar11 = lVar6 + -0x200000000 >> 0x20;
            lVar6 = lVar6 + -0x300000000 >> 0x20;
            if (iVar1 - lVar11 != 0) {
              memmove((this->entries)._M_elems + lVar6,(this->entries)._M_elems + lVar11,
                      (iVar1 - lVar11) * 0x18);
              iVar4 = this->size;
            }
            memmove((this->hashes)._M_elems + lVar6,(this->hashes)._M_elems + lVar11,
                    (long)(((iVar4 - iVar7) - (int)lVar13) + 3) << 3);
            if ((ushort)((ushort)(this->hashes)._M_elems[lVar8 + lVar14 + -1] >> 10) ==
                (ushort)uVar2) goto LAB_002a7ede;
            uVar5 = (this->occupation).occupation;
          }
          else if (iVar9 != 0) goto LAB_002a7ede;
          (this->occupation).occupation = uVar5 ^ 1L << (sbyte)uVar2;
LAB_002a7ede:
          (this->hashes)._M_elems[this->size] = 0;
          return true;
        }
        lVar6 = lVar6 + -0x100000000;
        lVar13 = lVar13 + 1;
        iVar9 = iVar9 + -1;
        puVar12 = puVar12 + 3;
      } while ((iVar7 - iVar1) + -3 + (int)lVar13 != 0);
    }
  }
  return false;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }